

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

void __thiscall foxxll::request::check_nref_failed(request *this,bool after)

{
  int iVar1;
  Logger *pLVar2;
  undefined4 extraout_var;
  char *local_1c8;
  char *local_1c0;
  request *local_1b8;
  size_t local_1b0;
  char *local_1a8 [3];
  Logger local_190;
  LoggerVoidify local_12;
  byte local_11;
  request *prStack_10;
  bool after_local;
  request *this_local;
  
  local_11 = after;
  prStack_10 = this;
  tlx::Logger::Logger(&local_190);
  pLVar2 = tlx::Logger::operator<<
                     (&local_190,
                      (char (*) [58])"WARNING: serious error, reference to the request is lost ");
  local_1a8[0] = "before";
  if ((local_11 & 1) != 0) {
    local_1a8[0] = "after";
  }
  pLVar2 = tlx::Logger::operator<<(pLVar2,local_1a8);
  pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [9])" serve()");
  pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [7])" nref=");
  local_1b0 = tlx::ReferenceCounter::reference_count(&this->super_reference_counter);
  pLVar2 = tlx::Logger::operator<<(pLVar2,&local_1b0);
  pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [7])" this=");
  local_1b8 = this;
  pLVar2 = tlx::Logger::operator<<(pLVar2,&local_1b8);
  pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [9])" offset=");
  pLVar2 = tlx::Logger::operator<<(pLVar2,&this->offset_);
  pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [9])" buffer=");
  pLVar2 = tlx::Logger::operator<<(pLVar2,&this->buffer_);
  pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [8])" bytes=");
  pLVar2 = tlx::Logger::operator<<(pLVar2,&this->bytes_);
  pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [5])" op=");
  local_1c0 = "WRITE";
  if (this->op_ == READ) {
    local_1c0 = "READ";
  }
  pLVar2 = tlx::Logger::operator<<(pLVar2,&local_1c0);
  pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [7])" file=");
  pLVar2 = tlx::Logger::operator<<(pLVar2,&this->file_);
  pLVar2 = tlx::Logger::operator<<(pLVar2,(char (*) [9])" iotype=");
  iVar1 = (*this->file_->_vptr_file[0xd])();
  local_1c8 = (char *)CONCAT44(extraout_var,iVar1);
  pLVar2 = tlx::Logger::operator<<(pLVar2,&local_1c8);
  tlx::LoggerVoidify::operator&(&local_12,pLVar2);
  tlx::Logger::~Logger(&local_190);
  return;
}

Assistant:

void request::check_nref_failed(bool after)
{
    TLX_LOG1 << "WARNING: serious error, reference to the request is lost " <<
    (after ? "after" : "before") << " serve()" <<
        " nref=" << reference_count() <<
        " this=" << this <<
        " offset=" << offset_ <<
        " buffer=" << buffer_ <<
        " bytes=" << bytes_ <<
        " op=" << ((op_ == READ) ? "READ" : "WRITE") <<
        " file=" << file_ <<
        " iotype=" << file_->io_type();
}